

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
slang::ast::ConditionalStatement::serializeTo(ConditionalStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  Expression *__n;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  iterator local_48;
  Condition *cond;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range2;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  ConditionalStatement *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"conditions");
  ASTSerializer::startArray(serializer,___range2);
  __begin2 = (iterator)&this->conditions;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                       *)__begin2);
  cond = nonstd::span_lite::
         span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::end
                   ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                     *)__begin2);
  for (; __end2 != cond; __end2 = __end2 + 1) {
    local_48 = __end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"expr");
    __n = not_null<const_slang::ast::Expression_*>::operator*(&local_48->expr);
    ASTSerializer::write(pAVar1,(int)local_58._M_len,local_58._M_str,(size_t)__n);
    pAVar1 = local_18;
    if (local_48->pattern != (Pattern *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"pattern");
      ASTSerializer::write(pAVar1,(int)local_68._M_len,local_68._M_str,(size_t)local_48->pattern);
    }
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"ifTrue");
  ASTSerializer::write(pAVar1,(int)local_78._M_len,local_78._M_str,(size_t)this->ifTrue);
  pAVar1 = local_18;
  if (this->ifFalse != (Statement *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"ifFalse");
    ASTSerializer::write(pAVar1,(int)local_88._M_len,local_88._M_str,(size_t)this->ifFalse);
  }
  return;
}

Assistant:

void ConditionalStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("ifTrue", ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}